

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kwsCheckIfNDefDefine.cxx
# Opt level: O2

bool __thiscall kws::Parser::CheckIfNDefDefine(Parser *this,char *match,bool uppercaseTheDefinition)

{
  string *psVar1;
  string *psVar2;
  char cVar3;
  pointer pcVar4;
  long lVar5;
  bool bVar6;
  bool bVar7;
  int iVar8;
  long lVar9;
  char *pcVar10;
  ulong uVar11;
  size_t pos;
  size_t sVar12;
  size_t sVar13;
  ostream *poVar14;
  size_t sVar15;
  byte bVar16;
  long lVar17;
  _Alloc_hider _Var18;
  bool bVar19;
  Error error;
  string toMatch;
  string ifndef;
  string define;
  string l;
  string extension;
  string nameofclass;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  psVar1 = &this->m_Filename;
  lVar9 = std::__cxx11::string::find((char *)psVar1,0x16226d);
  if (lVar9 != -1) {
    return false;
  }
  this->m_TestsDone[0xe] = true;
  pcVar10 = (char *)operator_new__(0x200);
  builtin_strncpy(pcVar10,"#ifndef/#define should match ",0x1e);
  std::__cxx11::string::assign((char *)(this->m_TestsDescription + 0xe));
  std::__cxx11::string::string((string *)&l,match,(allocator *)&error);
  while (uVar11 = std::__cxx11::string::find((char *)&l,0x162488), uVar11 != 0xffffffffffffffff) {
    std::__cxx11::string::replace((ulong)&l,uVar11,(char *)0x1);
  }
  bVar7 = true;
  while (uVar11 = std::__cxx11::string::find((char *)&l,0x1619b2), uVar11 != 0xffffffffffffffff) {
    std::__cxx11::string::replace((ulong)&l,uVar11,(char *)0x1);
  }
  std::__cxx11::string::append((string *)(this->m_TestsDescription + 0xe));
  operator_delete__(pcVar10);
  psVar2 = &this->m_BufferNoComment;
  pos = std::__cxx11::string::find((char *)psVar2,0x16228e);
  if (pos != 0xffffffffffffffff) {
    sVar12 = 0;
    sVar13 = pos;
    if ((long)pos < 1) {
      sVar13 = sVar12;
    }
    for (sVar15 = 0; sVar13 != sVar15; sVar15 = sVar15 + 1) {
      cVar3 = (psVar2->_M_dataplus)._M_p[sVar15];
      if (((cVar3 != '\r') && (cVar3 != ' ')) && (cVar3 != '\n')) {
        sVar12 = 1;
      }
    }
    if (sVar12 == 0) {
      bVar19 = false;
      sVar13 = pos;
      do {
        if (bVar19) {
          error.description._M_dataplus._M_p = (pointer)&error.description.field_2;
          error.description._M_string_length = 0;
          error.description.field_2._M_local_buf[0] = '\0';
          error.line = GetLineNumber(this,pos,true);
          error.number = 0xe;
          error.line2 = error.line;
          std::__cxx11::string::assign((char *)&error.description);
          std::vector<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_>::push_back
                    (&this->m_ErrorList,&error);
          std::__cxx11::string::~string((string *)&error.description);
          bVar7 = true;
          break;
        }
        pcVar4 = (psVar2->_M_dataplus)._M_p;
        lVar9 = sVar13 + 7;
        lVar5 = sVar13 + 9;
        do {
          lVar17 = lVar5;
          bVar16 = pcVar4[lVar9 + 1];
          lVar9 = lVar9 + 1;
          lVar5 = lVar17 + 1;
        } while (bVar16 == 0x20);
        while ((0x20 < bVar16 || ((0x100002400U >> ((ulong)bVar16 & 0x3f) & 1) == 0))) {
          bVar16 = pcVar4[lVar17];
          lVar17 = lVar17 + 1;
        }
        std::__cxx11::string::substr((ulong)&ifndef,(ulong)psVar2);
        sVar13 = lVar17 - 1;
        lVar9 = std::__cxx11::string::find((char *)psVar2,0x1622aa);
        if (lVar9 == -1) {
          error.description._M_dataplus._M_p = (pointer)&error.description.field_2;
          error.description._M_string_length = 0;
          error.description.field_2._M_local_buf[0] = '\0';
          error.line = GetLineNumber(this,sVar13,true);
          error.number = 0xe;
          error.line2 = error.line;
          std::__cxx11::string::assign((char *)&error.description);
          std::vector<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_>::push_back
                    (&this->m_ErrorList,&error);
          std::__cxx11::string::~string((string *)&error.description);
          bVar6 = false;
          bVar7 = false;
        }
        else {
          pcVar4 = (psVar2->_M_dataplus)._M_p;
          sVar12 = lVar9 + 6;
          do {
            bVar16 = pcVar4[sVar12 + 1];
            sVar12 = sVar12 + 1;
          } while (bVar16 == 0x20);
          while ((0x20 < bVar16 || ((0x100002400U >> ((ulong)bVar16 & 0x3f) & 1) == 0))) {
            bVar16 = pcVar4[sVar12 + 1];
            sVar12 = sVar12 + 1;
          }
          std::__cxx11::string::substr((ulong)&define,(ulong)psVar2);
          bVar6 = std::operator!=(&ifndef,&define);
          if (bVar6) {
            sVar13 = std::__cxx11::string::find((char *)psVar2,0x16228e);
            if (sVar13 == 0xffffffffffffffff) {
              bVar19 = true;
            }
          }
          else if ((this->m_Filename)._M_string_length == 0) {
            poVar14 = std::operator<<((ostream *)&std::cout,
                                      "CheckIfNDefDefine() : m_Filename should be set");
            std::endl<char,std::char_traits<char>>(poVar14);
            bVar7 = false;
          }
          else {
            std::__cxx11::string::find_last_of((char *)psVar1,0x163441);
            std::__cxx11::string::find_last_of((char *)psVar1,0x155501);
            std::__cxx11::string::substr((ulong)&nameofclass,(ulong)psVar1);
            std::__cxx11::string::substr((ulong)&extension,(ulong)psVar1);
            std::__cxx11::string::string((string *)&toMatch,match,(allocator *)&error);
            uVar11 = std::__cxx11::string::find((char *)&toMatch,0x1622f5);
            if (uVar11 != 0xffffffffffffffff) {
              std::__cxx11::string::replace((ulong)&toMatch,uVar11,(string *)0xd);
            }
            uVar11 = std::__cxx11::string::find((char *)&toMatch,0x15449e);
            if (uVar11 != 0xffffffffffffffff) {
              std::__cxx11::string::replace((ulong)&toMatch,uVar11,(string *)0xb);
            }
            _Var18._M_p = toMatch._M_dataplus._M_p;
            if (uppercaseTheDefinition) {
              for (; _Var18._M_p != toMatch._M_dataplus._M_p + toMatch._M_string_length;
                  _Var18._M_p = _Var18._M_p + 1) {
                iVar8 = toupper((int)*_Var18._M_p);
                *_Var18._M_p = (char)iVar8;
              }
            }
            bVar7 = std::operator!=(&ifndef,&toMatch);
            if (bVar7) {
              error.description._M_dataplus._M_p = (pointer)&error.description.field_2;
              error.description._M_string_length = 0;
              error.description.field_2._M_local_buf[0] = '\0';
              error.line = GetLineNumber(this,pos,true);
              error.line2 = GetLineNumber(this,sVar12,true);
              error.number = 0xe;
              std::__cxx11::string::assign((char *)&error.description);
              std::operator+(&local_70,&ifndef," v.s. ");
              std::operator+(&local_50,&local_70,&toMatch);
              std::__cxx11::string::operator=((string *)&error.description,(string *)&local_50);
              std::__cxx11::string::~string((string *)&local_50);
              std::__cxx11::string::~string((string *)&local_70);
              std::vector<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_>::push_back
                        (&this->m_ErrorList,&error);
              std::__cxx11::string::~string((string *)&error.description);
            }
            bVar7 = !bVar7;
            std::__cxx11::string::~string((string *)&toMatch);
            std::__cxx11::string::~string((string *)&extension);
            std::__cxx11::string::~string((string *)&nameofclass);
          }
          std::__cxx11::string::~string((string *)&define);
        }
        std::__cxx11::string::~string((string *)&ifndef);
      } while (bVar6 != false);
      goto LAB_0013e0ea;
    }
  }
  error.description._M_dataplus._M_p = (pointer)&error.description.field_2;
  error.description._M_string_length = 0;
  error.description.field_2._M_local_buf[0] = '\0';
  error.line = GetLineNumber(this,0,true);
  error.number = 0xe;
  error.line2 = error.line;
  std::__cxx11::string::assign((char *)&error.description);
  std::vector<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_>::push_back
            (&this->m_ErrorList,&error);
  std::__cxx11::string::~string((string *)&error.description);
  bVar7 = false;
LAB_0013e0ea:
  std::__cxx11::string::~string((string *)&l);
  return bVar7;
}

Assistant:

bool Parser::CheckIfNDefDefine(const char* match, bool uppercaseTheDefinition)
{
  // Check only if we are not a .cxx or .cc or .c file
  if(m_Filename.find(".c") != std::string::npos)
    {
    return false;
    }

  m_TestsDone[NDEFINE] = true;
  constexpr size_t length = 512;
  char* val = new char[length];
  snprintf(val,length,"#ifndef/#define should match ");
  m_TestsDescription[NDEFINE] = val;
  // Replace < and >
  std::string l = match;
  auto inf = static_cast<long int>(l.find("<", 0));
  while(inf != -1)
    {
    l.replace(inf,1,"&lt;");
    inf = static_cast<long int>(l.find("<",0));
    }

    auto sup = static_cast<long int>(l.find(">", 0));
    while (sup != -1) {
      l.replace(sup, 1, "&gt;");
      sup = static_cast<long int>(l.find(">", 0));
    }
  m_TestsDescription[NDEFINE] += l;
  delete [] val;

  bool hasError = false;
  bool notDefined = false;


  // We should have a #ifndef/#define on the same line and we go
  // through the file until we find a correct match.
  bool doesMatch = true;

  // Find the #ifndef word in the file
  auto pos = static_cast<long int>(m_BufferNoComment.find("#ifndef", 0));
  if(pos == -1)
    {
    notDefined = true;
    }
  else
    {
    for(long int i=0;i<pos;i++)
      {
      if((m_BufferNoComment[i] != ' ')
        && (m_BufferNoComment[i] != '\r')
        && (m_BufferNoComment[i] != '\n')
        )
        {
        notDefined = true;
        }
      }
    }

  long int definepos = pos;

  if(notDefined)
    {
    Error error;
    error.line = this->GetLineNumber(0,true);
    error.line2 = error.line;
    error.number = NDEFINE;
    error.description = "#ifndef not defined";
    m_ErrorList.push_back(error);
    return false;
    }

  while(!notDefined)
    {
    doesMatch = true;

    // Find the word after #ifndef
    pos += 8;
   
    while(m_BufferNoComment[pos] == ' ')
      {
      pos++;
      }
    long int begin = pos;
    while((m_BufferNoComment[pos] != ' ') 
      &&(m_BufferNoComment[pos] != '\r')
      &&(m_BufferNoComment[pos] != '\n')
      )
      {
      pos++;
      }
    long int end = pos;
    std::string ifndef = m_BufferNoComment.substr(begin,end-begin);

    // Find the word after #define
    auto posDef = static_cast<long int>(m_BufferNoComment.find("#define", end));

    if(posDef == -1)
      {
      Error error;
      error.line = this->GetLineNumber(end,true);
      error.line2 = error.line;
      error.number = NDEFINE;
      error.description = "#define not defined";
      m_ErrorList.push_back(error);
      return false;
      }
    
    posDef += 7; 
    while(m_BufferNoComment[posDef] == ' ')
      {
      posDef++;
      }
    begin = posDef;
    while((m_BufferNoComment[posDef] != ' ') 
      &&(m_BufferNoComment[posDef] != '\r')
      &&(m_BufferNoComment[posDef] != '\n')
      )
      {
      posDef++;
      }
    end = posDef;
    std::string define = m_BufferNoComment.substr(begin,end-begin);

    if(ifndef != define)
      {
      doesMatch = false;
      }

    if(doesMatch)
      {
      if (m_Filename.empty()) {
        std::cout << "CheckIfNDefDefine() : m_Filename should be set" << std::endl;
        return false;
      }

      auto point = static_cast<long int>(m_Filename.find_last_of("."));
      auto slash = static_cast<long int>(m_Filename.find_last_of("/"));

      std::string nameofclass = m_Filename.substr(slash+1,point-slash-1);
      std::string extension = m_Filename.substr(point+1,m_Filename.size()-point-1);

      // construct the string
      std::string toMatch = match;
      auto posnofc = static_cast<long int>(toMatch.find("[NameOfClass]"));
      if(posnofc != -1)
        {
        toMatch.replace(posnofc,13,nameofclass);
        }
      posnofc = static_cast<long int>(toMatch.find("[Extension]"));
      if(posnofc != -1)
        {
        toMatch.replace(posnofc,11,extension);
        }

      if(uppercaseTheDefinition)
        {
        for(std::string::iterator it = toMatch.begin(); it != toMatch.end(); it++)
          *it = static_cast<char>(std::toupper(*it));
        }

      if(ifndef != toMatch)
        {   
        Error error;
        error.line = this->GetLineNumber(definepos,true);
        error.line2 = this->GetLineNumber(end,true);
        error.number = NDEFINE;
        error.description = "#ifndef/#define does not match expression";
        error.description = ifndef+" v.s. "+toMatch;
        m_ErrorList.push_back(error);
        return false;
        }
      else
        {
        return true;
        }
      }

    pos = static_cast<long int>(m_BufferNoComment.find("#ifndef",pos+1));

    if(pos == -1)
      {
      notDefined = true;
      }
    /*else
      {
      for(int i=0;i<pos;i++)
        {
        if((m_BufferNoComment[i] != ' ')
          && (m_BufferNoComment[i] != '\r')
          && (m_BufferNoComment[i] != '\n')
          )
          {
          std::cout << "Not defined!" << std::endl;
          notDefined = true;
          }
        }
      }*/

    } // end looking for entire file


    Error error;
    error.line = this->GetLineNumber(definepos,true);
    error.line2 = error.line;
    error.number = NDEFINE;
    error.description = "#ifndef/#define does not match";
    m_ErrorList.push_back(error);

  return !hasError;
}